

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void endElementNsSplit(void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI)

{
  code *pcVar1;
  xmlChar *extraout_RDX;
  
  if (ctx != (void *)0x0) {
    if ((*(long *)((long)ctx + 0x10) != 0) &&
       (pcVar1 = *(code **)(*(long *)((long)ctx + 0x10) + 0xf0), pcVar1 != (code *)0x0)) {
      (*pcVar1)(*(undefined8 *)((long)ctx + 0x20),localname,prefix,URI);
      prefix = extraout_RDX;
    }
    if (*(void **)((long)ctx + 0x128) != (void *)0x0) {
      xmlSchemaSAXHandleEndElementNs(*(void **)((long)ctx + 0x128),localname,prefix,URI);
      return;
    }
  }
  return;
}

Assistant:

static void
endElementNsSplit(void *ctx, const xmlChar * localname,
		    const xmlChar * prefix, const xmlChar * URI) {
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if (ctxt == NULL)
        return;
    if ((ctxt->user_sax != NULL) &&
        (ctxt->user_sax->endElementNs != NULL))
	ctxt->user_sax->endElementNs(ctxt->user_data, localname, prefix, URI);
    if (ctxt->ctxt != NULL)
	xmlSchemaSAXHandleEndElementNs(ctxt->ctxt, localname, prefix, URI);
}